

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

Vec_Int_t *
Fra_SmlSelectMaxCost(Vec_Int_t *vImps,int *pCosts,int nCostMax,int nImpLimit,int *pCostRange)

{
  int iVar1;
  int *__s;
  Vec_Int_t *p;
  int local_48;
  int local_44;
  int c;
  int i;
  int Imp;
  int nImpCount;
  int *pCostCount;
  Vec_Int_t *vImpsNew;
  int *pCostRange_local;
  int nImpLimit_local;
  int nCostMax_local;
  int *pCosts_local;
  Vec_Int_t *vImps_local;
  
  iVar1 = Vec_IntSize(vImps);
  if (iVar1 < nImpLimit) {
    __assert_fail("Vec_IntSize(vImps) >= nImpLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0xf8,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
  }
  __s = (int *)malloc((long)(nCostMax + 1) << 2);
  memset(__s,0,(long)(nCostMax + 1) << 2);
  for (local_44 = 0; iVar1 = Vec_IntSize(vImps), local_44 < iVar1; local_44 = local_44 + 1) {
    if (nCostMax < pCosts[local_44]) {
      __assert_fail("pCosts[i] <= nCostMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                    ,0xfe,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
    }
    __s[pCosts[local_44]] = __s[pCosts[local_44]] + 1;
  }
  if (*__s != 0) {
    __assert_fail("pCostCount[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/fra/fraImp.c"
                  ,0x101,"Vec_Int_t *Fra_SmlSelectMaxCost(Vec_Int_t *, int *, int, int, int *)");
  }
  i = 0;
  local_48 = nCostMax;
  while ((0 < local_48 && (i = __s[local_48] + i, i < nImpLimit))) {
    local_48 = local_48 + -1;
  }
  p = Vec_IntAlloc(nImpLimit);
  for (local_44 = 0; iVar1 = Vec_IntSize(vImps), local_44 < iVar1; local_44 = local_44 + 1) {
    iVar1 = Vec_IntEntry(vImps,local_44);
    if (local_48 <= pCosts[local_44]) {
      Vec_IntPush(p,iVar1);
      iVar1 = Vec_IntSize(p);
      if (iVar1 == nImpLimit) break;
    }
  }
  if (__s != (int *)0x0) {
    free(__s);
  }
  if (pCostRange != (int *)0x0) {
    *pCostRange = local_48;
  }
  return p;
}

Assistant:

Vec_Int_t * Fra_SmlSelectMaxCost( Vec_Int_t * vImps, int * pCosts, int nCostMax, int nImpLimit, int * pCostRange )
{
    Vec_Int_t * vImpsNew;
    int * pCostCount, nImpCount, Imp, i, c;
    assert( Vec_IntSize(vImps) >= nImpLimit );
    // count how many implications have each cost
    pCostCount = ABC_ALLOC( int, nCostMax + 1 );
    memset( pCostCount, 0, sizeof(int) * (nCostMax + 1) );
    for ( i = 0; i < Vec_IntSize(vImps); i++ )
    {
        assert( pCosts[i] <= nCostMax );
        pCostCount[ pCosts[i] ]++;
    }
    assert( pCostCount[0] == 0 );
    // select the bound on the cost (above this bound, implication will be included)
    nImpCount = 0;
    for ( c = nCostMax; c > 0; c-- )
    {
        nImpCount += pCostCount[c];
        if ( nImpCount >= nImpLimit )
            break;
    }
//    printf( "Cost range >= %d.\n", c );
    // collect implications with the given costs
    vImpsNew = Vec_IntAlloc( nImpLimit );
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        if ( pCosts[i] < c )
            continue;
        Vec_IntPush( vImpsNew, Imp );
        if ( Vec_IntSize( vImpsNew ) == nImpLimit )
            break;
    }
    ABC_FREE( pCostCount );
    if ( pCostRange )
        *pCostRange = c;
    return vImpsNew;
}